

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCpRestore<(moira::Instr)150,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  Ea<(moira::Mode)3,_2> ea;
  Av<(moira::Instr)150,_(moira::Mode)3,_2> local_30;
  u32 local_2c;
  ushort local_28;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)150,(moira::Mode)3,2>(this,str,addr,op);
    return;
  }
  local_28 = op & 7;
  local_2c = *addr;
  StrWriter::operator<<(str,op >> 9 & 7);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00," ");
  StrWriter::operator<<(this_00,(Ea<(moira::Mode)3,_2> *)&local_2c);
  local_30.ext1 = 0;
  StrWriter::operator<<(str,&local_30);
  return;
}

Assistant:

void
Moira::dasmCpRestore(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto dn = ( _____________xxx(op) );
    auto id = ( ____xxx_________(op) );
    auto ea = Op <M,S> (dn, addr);

    str << id << Ins<I>{} << " " << ea;
    str << Av<I, M, S>{};
}